

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix.cpp
# Opt level: O1

void __thiscall Timidity::GF1Envelope::ApplyToAmp(GF1Envelope *this,Voice *v)

{
  double dVar1;
  
  dVar1 = (double)v->attenuation;
  if (v->tremolo_phase_increment != 0) {
    dVar1 = dVar1 * (double)v->tremolo_volume;
  }
  dVar1 = exp2(dVar1 * 16.0 * (double)((float)this->volume * 9.313226e-10) + -16.0);
  v->left_mix = (float)((double)v->left_offset * dVar1 * 0.5);
  v->right_mix = (float)((double)v->right_offset * dVar1 * 0.5);
  return;
}

Assistant:

void GF1Envelope::ApplyToAmp(Voice *v)
{
	double env_vol = v->attenuation;
	double final_amp;

	final_amp = FINAL_MIX_SCALE;
	if (v->tremolo_phase_increment != 0)
	{ // [RH] FIXME: This is wrong. Tremolo should offset the
	  // envelope volume, not scale it.
		env_vol *= v->tremolo_volume;
	}
	env_vol *= volume / float(1 << 30);
	env_vol = calc_gf1_amp(env_vol);
	env_vol *= final_amp;
	v->left_mix = float(env_vol * v->left_offset);
	v->right_mix = float(env_vol * v->right_offset);
}